

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_complete(char *zSql)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uchar uVar13;
  bool bVar14;
  
  bVar3 = 0;
  do {
    bVar6 = *zSql;
    uVar10 = (uint)bVar6;
    if (bVar6 < 0x27) {
      if (bVar6 < 0xc) {
        if (bVar6 - 9 < 2) goto LAB_001289c1;
        if (bVar6 == 0) {
LAB_00128d0e:
          bVar14 = bVar3 == 1;
          goto LAB_00128d13;
        }
      }
      else {
        if ((bVar6 - 0xc < 2) || (uVar10 == 0x20)) {
LAB_001289c1:
          lVar5 = 1;
          goto LAB_001289c6;
        }
        if (uVar10 == 0x22) goto LAB_00128997;
      }
LAB_00128a0f:
      if ((""[bVar6] & 0x46) == 0) {
LAB_00128ae5:
        lVar5 = 2;
      }
      else {
        lVar9 = 0;
        lVar7 = -0x100000000;
        do {
          lVar7 = lVar7 + 0x100000000;
          lVar5 = lVar9 + 1;
          lVar9 = lVar9 + 1;
        } while ((""[((byte *)zSql)[lVar5]] & 0x46) != 0);
        lVar5 = 2;
        uVar11 = (ulong)(uVar10 - 0x43);
        if (uVar10 - 0x43 < 0x32) {
          iVar8 = (int)lVar9;
          if ((0x100000001U >> (uVar11 & 0x3f) & 1) == 0) {
            if ((0x400000004U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x2000000020000U >> (uVar11 & 0x3f) & 1) != 0) {
                if (iVar8 == 9) {
LAB_00128ca0:
                  lVar9 = 0;
                  do {
                    if ((ulong)((byte *)zSql)[lVar9] == 0) {
                      uVar4 = ""[(byte)"temporary"[lVar9]];
                      uVar13 = '\0';
LAB_00128ceb:
                      lVar5 = 5;
LAB_00128cf4:
                      if (uVar13 != uVar4) goto LAB_00128cf9;
                      break;
                    }
                    uVar13 = ""[((byte *)zSql)[lVar9]];
                    uVar4 = ""[(byte)"temporary"[lVar9]];
                    if (uVar13 != uVar4) goto LAB_00128ceb;
                    lVar9 = lVar9 + 1;
                    lVar5 = 5;
                  } while (lVar9 != 9);
                }
                else if (iVar8 == 7) {
                  lVar9 = 0;
                  do {
                    if ((ulong)((byte *)zSql)[lVar9] == 0) {
                      uVar4 = ""[(byte)"trigger"[lVar9]];
                      uVar13 = '\0';
LAB_00128c5d:
                      lVar5 = 6;
                      goto LAB_00128cf4;
                    }
                    uVar13 = ""[((byte *)zSql)[lVar9]];
                    uVar4 = ""[(byte)"trigger"[lVar9]];
                    if (uVar13 != uVar4) goto LAB_00128c5d;
                    lVar9 = lVar9 + 1;
                    lVar5 = 6;
                  } while (lVar9 != 7);
                }
                else {
                  if (iVar8 != 4) goto LAB_00128cf9;
                  lVar12 = 0;
                  do {
                    if ((ulong)((byte *)zSql)[lVar12] == 0) {
                      uVar4 = ""[(byte)"temp"[lVar12]];
                      uVar13 = '\0';
LAB_00128c7e:
                      lVar5 = 5;
                      if (uVar13 != uVar4) {
                        if ((byte *)zSql == (byte *)0x0 || lVar9 != 9) goto LAB_00128cf9;
                        goto LAB_00128ca0;
                      }
                      break;
                    }
                    uVar13 = ""[((byte *)zSql)[lVar12]];
                    uVar4 = ""[(byte)"temp"[lVar12]];
                    if (uVar13 != uVar4) goto LAB_00128c7e;
                    lVar12 = lVar12 + 1;
                    lVar5 = 5;
                  } while (lVar12 != 4);
                }
              }
            }
            else if (iVar8 == 3) {
              lVar5 = 0;
              do {
                if ((ulong)((byte *)zSql)[lVar5] == 0) {
                  uVar4 = ""[(byte)"end"[lVar5]];
                  uVar13 = '\0';
LAB_00128c3c:
                  lVar5 = 7;
                  goto LAB_00128cf4;
                }
                uVar13 = ""[((byte *)zSql)[lVar5]];
                uVar4 = ""[(byte)"end"[lVar5]];
                if (uVar13 != uVar4) goto LAB_00128c3c;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
              lVar5 = 7;
            }
            else {
              if (iVar8 != 7) goto LAB_00128cf9;
              lVar5 = 0;
              do {
                if ((ulong)((byte *)zSql)[lVar5] == 0) {
                  uVar4 = ""[(byte)"explain"[lVar5]];
                  uVar13 = '\0';
LAB_00128c22:
                  lVar5 = 3;
                  goto LAB_00128cf4;
                }
                uVar13 = ""[((byte *)zSql)[lVar5]];
                uVar4 = ""[(byte)"explain"[lVar5]];
                if (uVar13 != uVar4) goto LAB_00128c22;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 7);
              lVar5 = 3;
            }
          }
          else if (lVar9 == 6) {
            lVar5 = 0;
            do {
              if ((ulong)((byte *)zSql)[lVar5] == 0) {
                uVar4 = ""[(byte)"create"[lVar5]];
                uVar13 = '\0';
LAB_00128c08:
                lVar5 = 4;
                goto LAB_00128cf4;
              }
              uVar13 = ""[((byte *)zSql)[lVar5]];
              uVar4 = ""[(byte)"create"[lVar5]];
              if (uVar13 != uVar4) goto LAB_00128c08;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 6);
            lVar5 = 4;
          }
          else {
LAB_00128cf9:
            lVar5 = 2;
          }
        }
        zSql = (char *)((byte *)zSql + (lVar7 >> 0x20));
      }
    }
    else if (bVar6 < 0x3b) {
      if (bVar6 == 0x27) {
LAB_00128997:
        do {
          bVar2 = ((byte *)zSql)[1];
          zSql = (char *)((byte *)zSql + 1);
          if (bVar2 == 0) break;
        } while (bVar2 != bVar6);
        lVar5 = 2;
        if (bVar2 == 0) {
LAB_00128d0a:
          bVar14 = false;
LAB_00128d13:
          return (int)bVar14;
        }
      }
      else if (bVar6 == 0x2d) {
        lVar5 = 2;
        if (((byte *)zSql)[1] == 0x2d) {
          bVar6 = 0x2d;
          while( true ) {
            if (bVar6 == 0) goto LAB_00128d0e;
            if (bVar6 == 10) break;
            bVar6 = ((byte *)zSql)[1];
            zSql = (char *)((byte *)zSql + 1);
          }
          goto LAB_001289c1;
        }
      }
      else {
        if (bVar6 != 0x2f) goto LAB_00128a0f;
        lVar5 = 2;
        if (((byte *)zSql)[1] == 0x2a) {
          zSql = (char *)((byte *)zSql + 3);
          do {
            if (((byte *)zSql)[-1] == 0x2a) {
              if (*zSql == 0x2f) goto LAB_001289c1;
            }
            else if (((byte *)zSql)[-1] == 0) goto LAB_00128d0a;
            zSql = (char *)((byte *)zSql + 1);
          } while( true );
        }
      }
    }
    else {
      if (bVar6 != 0x3b) {
        if (bVar6 == 0x60) goto LAB_00128997;
        if (bVar6 != 0x5b) goto LAB_00128a0f;
        do {
          pbVar1 = (byte *)zSql + 1;
          if (*pbVar1 == 0) goto LAB_00128d0a;
          zSql = (char *)((byte *)zSql + 1);
        } while (*pbVar1 != 0x5d);
        goto LAB_00128ae5;
      }
      lVar5 = 0;
    }
LAB_001289c6:
    bVar3 = sqlite3_complete::trans[bVar3][lVar5];
    zSql = (char *)((byte *)zSql + 1);
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_complete(const char *zSql){
  u8 state = 0;   /* Current state, using numbers defined in header comment */
  u8 token;       /* Value of the next token */

#ifndef SQLITE_OMIT_TRIGGER
  /* A complex statement machine used to detect the end of a CREATE TRIGGER
  ** statement.  This is the normal case.
  */
  static const u8 trans[8][8] = {
                     /* Token:                                                */
     /* State:       **  SEMI  WS  OTHER  EXPLAIN  CREATE  TEMP  TRIGGER  END */
     /* 0 INVALID: */ {    1,  0,     2,       3,      4,    2,       2,   2, },
     /* 1   START: */ {    1,  1,     2,       3,      4,    2,       2,   2, },
     /* 2  NORMAL: */ {    1,  2,     2,       2,      2,    2,       2,   2, },
     /* 3 EXPLAIN: */ {    1,  3,     3,       2,      4,    2,       2,   2, },
     /* 4  CREATE: */ {    1,  4,     2,       2,      2,    4,       5,   2, },
     /* 5 TRIGGER: */ {    6,  5,     5,       5,      5,    5,       5,   5, },
     /* 6    SEMI: */ {    6,  6,     5,       5,      5,    5,       5,   7, },
     /* 7     END: */ {    1,  7,     5,       5,      5,    5,       5,   5, },
  };
#else
  /* If triggers are not supported by this compile then the statement machine
  ** used to detect the end of a statement is much simpler
  */
  static const u8 trans[3][3] = {
                     /* Token:           */
     /* State:       **  SEMI  WS  OTHER */
     /* 0 INVALID: */ {    1,  0,     2, },
     /* 1   START: */ {    1,  1,     2, },
     /* 2  NORMAL: */ {    1,  2,     2, },
  };
#endif /* SQLITE_OMIT_TRIGGER */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zSql==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  while( *zSql ){
    switch( *zSql ){
      case ';': {  /* A semicolon */
        token = tkSEMI;
        break;
      }
      case ' ':
      case '\r':
      case '\t':
      case '\n':
      case '\f': {  /* White space is ignored */
        token = tkWS;
        break;
      }
      case '/': {   /* C-style comments */
        if( zSql[1]!='*' ){
          token = tkOTHER;
          break;
        }
        zSql += 2;
        while( zSql[0] && (zSql[0]!='*' || zSql[1]!='/') ){ zSql++; }
        if( zSql[0]==0 ) return 0;
        zSql++;
        token = tkWS;
        break;
      }
      case '-': {   /* SQL-style comments from "--" to end of line */
        if( zSql[1]!='-' ){
          token = tkOTHER;
          break;
        }
        while( *zSql && *zSql!='\n' ){ zSql++; }
        if( *zSql==0 ) return state==1;
        token = tkWS;
        break;
      }
      case '[': {   /* Microsoft-style identifiers in [...] */
        zSql++;
        while( *zSql && *zSql!=']' ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      case '`':     /* Grave-accent quoted symbols used by MySQL */
      case '"':     /* single- and double-quoted strings */
      case '\'': {
        int c = *zSql;
        zSql++;
        while( *zSql && *zSql!=c ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      default: {
#ifdef SQLITE_EBCDIC
        unsigned char c;
#endif
        if( IdChar((u8)*zSql) ){
          /* Keywords and unquoted identifiers */
          int nId;
          for(nId=1; IdChar(zSql[nId]); nId++){}
#ifdef SQLITE_OMIT_TRIGGER
          token = tkOTHER;
#else
          switch( *zSql ){
            case 'c': case 'C': {
              if( nId==6 && sqlite3StrNICmp(zSql, "create", 6)==0 ){
                token = tkCREATE;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 't': case 'T': {
              if( nId==7 && sqlite3StrNICmp(zSql, "trigger", 7)==0 ){
                token = tkTRIGGER;
              }else if( nId==4 && sqlite3StrNICmp(zSql, "temp", 4)==0 ){
                token = tkTEMP;
              }else if( nId==9 && sqlite3StrNICmp(zSql, "temporary", 9)==0 ){
                token = tkTEMP;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 'e':  case 'E': {
              if( nId==3 && sqlite3StrNICmp(zSql, "end", 3)==0 ){
                token = tkEND;
              }else
#ifndef SQLITE_OMIT_EXPLAIN
              if( nId==7 && sqlite3StrNICmp(zSql, "explain", 7)==0 ){
                token = tkEXPLAIN;
              }else
#endif
              {
                token = tkOTHER;
              }
              break;
            }
            default: {
              token = tkOTHER;
              break;
            }
          }
#endif /* SQLITE_OMIT_TRIGGER */
          zSql += nId-1;
        }else{
          /* Operators and special symbols */
          token = tkOTHER;
        }
        break;
      }
    }
    state = trans[state][token];
    zSql++;
  }
  return state==1;
}